

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaPValAttrBlockFinal
              (xmlChar *value,int *flags,int flagAll,int flagExtension,int flagRestriction,
              int flagSubstitution,int flagList,int flagUnion)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  xmlChar *str1;
  long lVar5;
  
  iVar2 = -1;
  if (value != (xmlChar *)0x0 && flags != (int *)0x0) {
    if (*value == '\0') {
      iVar2 = 0;
    }
    else {
      iVar2 = xmlStrEqual(value,(xmlChar *)"#all");
      if (iVar2 == 0) {
        iVar2 = 0;
        do {
          while (((ulong)*value < 0x21 && ((0x100002600U >> ((ulong)*value & 0x3f) & 1) != 0))) {
            value = value + 1;
          }
          lVar5 = 0;
          while ((0x20 < (ulong)value[lVar5] ||
                 ((0x100002601U >> ((ulong)value[lVar5] & 0x3f) & 1) == 0))) {
            lVar5 = lVar5 + 1;
          }
          if (lVar5 == 0) {
            return 0;
          }
          str1 = xmlStrndup(value,(int)lVar5);
          iVar3 = xmlStrEqual(str1,(xmlChar *)"extension");
          if (iVar3 == 0) {
            iVar3 = xmlStrEqual(str1,(xmlChar *)"restriction");
            if (iVar3 == 0) {
              iVar3 = xmlStrEqual(str1,(xmlChar *)"substitution");
              if (iVar3 == 0) {
                iVar3 = xmlStrEqual(str1,"list");
                if (iVar3 == 0) {
                  iVar3 = xmlStrEqual(str1,"union");
                  bVar1 = false;
                  if ((flagList != -1) && (iVar3 != 0)) {
                    bVar1 = true;
                    if ((flagList & *flags) == 0) {
                      uVar4 = *flags | flagList;
                      goto LAB_00194f9e;
                    }
                  }
                }
                else {
                  if (flagSubstitution == -1) goto LAB_00194ffb;
                  bVar1 = true;
                  if ((*flags & flagSubstitution) == 0) {
                    uVar4 = *flags | flagSubstitution;
                    goto LAB_00194f9e;
                  }
                }
              }
              else if (flagRestriction == -1) {
LAB_00194ffb:
                bVar1 = false;
              }
              else {
                bVar1 = true;
                if ((*flags & flagRestriction) == 0) {
                  uVar4 = *flags | flagRestriction;
                  goto LAB_00194f9e;
                }
              }
            }
            else {
              bVar1 = true;
              if ((flagExtension & *flags) == 0) {
                uVar4 = *flags | flagExtension;
                goto LAB_00194f9e;
              }
            }
          }
          else {
            if (flagAll == -1) goto LAB_00194ffb;
            bVar1 = true;
            if ((*flags & flagAll) == 0) {
              uVar4 = *flags | flagAll;
LAB_00194f9e:
              *flags = uVar4;
              bVar1 = true;
            }
          }
          if (str1 != (xmlChar *)0x0) {
            (*xmlFree)(str1);
          }
          if (!bVar1) {
            return 1;
          }
          value = value + lVar5;
        } while (*value != 0);
      }
      else {
        if (flagAll != -1) {
          *flags = *flags | flagAll;
        }
        if (flagRestriction == -1) {
          flagRestriction = 0;
        }
        *flags = flagRestriction | *flags | flagExtension;
        if (flagSubstitution != -1) {
          *flags = *flags | flagSubstitution;
        }
        iVar2 = 0;
        if (flagList != -1) {
          *flags = *flags | flagList;
          iVar2 = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int
xmlSchemaPValAttrBlockFinal(const xmlChar *value,
			    int *flags,
			    int flagAll,
			    int flagExtension,
			    int flagRestriction,
			    int flagSubstitution,
			    int flagList,
			    int flagUnion)
{
    int ret = 0;

    /*
    * TODO: This does not check for duplicate entries.
    */
    if ((flags == NULL) || (value == NULL))
	return (-1);
    if (value[0] == 0)
	return (0);
    if (xmlStrEqual(value, BAD_CAST "#all")) {
	if (flagAll != -1)
	    *flags |= flagAll;
	else {
	    if (flagExtension != -1)
		*flags |= flagExtension;
	    if (flagRestriction != -1)
		*flags |= flagRestriction;
	    if (flagSubstitution != -1)
		*flags |= flagSubstitution;
	    if (flagList != -1)
		*flags |= flagList;
	    if (flagUnion != -1)
		*flags |= flagUnion;
	}
    } else {
	const xmlChar *end, *cur = value;
	xmlChar *item;

	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    item = xmlStrndup(cur, end - cur);
	    if (xmlStrEqual(item, BAD_CAST "extension")) {
		if (flagExtension != -1) {
		    if ((*flags & flagExtension) == 0)
			*flags |= flagExtension;
		} else
		    ret = 1;
	    } else if (xmlStrEqual(item, BAD_CAST "restriction")) {
		if (flagRestriction != -1) {
		    if ((*flags & flagRestriction) == 0)
			*flags |= flagRestriction;
		} else
		    ret = 1;
	    } else if (xmlStrEqual(item, BAD_CAST "substitution")) {
		if (flagSubstitution != -1) {
		    if ((*flags & flagSubstitution) == 0)
			*flags |= flagSubstitution;
		} else
		    ret = 1;
	    } else if (xmlStrEqual(item, BAD_CAST "list")) {
		if (flagList != -1) {
		    if ((*flags & flagList) == 0)
			*flags |= flagList;
		} else
		    ret = 1;
	    } else if (xmlStrEqual(item, BAD_CAST "union")) {
		if (flagUnion != -1) {
		    if ((*flags & flagUnion) == 0)
			*flags |= flagUnion;
		} else
		    ret = 1;
	    } else
		ret = 1;
	    if (item != NULL)
		xmlFree(item);
	    cur = end;
	} while ((ret == 0) && (*cur != 0));
    }

    return (ret);
}